

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O3

void __thiscall capnp::anon_unknown_0::TestCase63::run(TestCase63 *this)

{
  long this_00;
  undefined8 uVar1;
  ArrayPtr<const_kj::StringPtr> importPath_00;
  ArrayPtr<const_kj::StringPtr> importPath_01;
  ArrayPtr<const_kj::StringPtr> importPath_02;
  ArrayPtr<const_kj::StringPtr> importPath_03;
  ArrayPtr<const_kj::StringPtr> importPath_04;
  Field field;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  Field field_05;
  Field field_06;
  StructSchema SVar2;
  uint64_t uVar3;
  WirePointer *pWVar4;
  Schema SVar5;
  Schema SVar6;
  char *pcVar7;
  int iVar8;
  bool bVar9;
  CapTableReader *pCVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  Reader RVar13;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr displayName;
  StringPtr nestedName;
  StringPtr displayName_00;
  StringPtr nestedName_00;
  StringPtr displayName_01;
  StringPtr nestedName_01;
  StringPtr displayName_02;
  StringPtr nestedName_02;
  StringPtr displayName_03;
  StringPtr content;
  StringPtr content_00;
  StringPtr content_01;
  StringPtr content_02;
  StringPtr content_03;
  StringPtr content_04;
  StringPtr diskPath;
  StringPtr diskPath_00;
  StringPtr diskPath_01;
  StringPtr diskPath_02;
  StringPtr diskPath_03;
  Fault f;
  ParsedSchema bazSchema;
  StructSchema graultStruct;
  StructSchema corgeStruct;
  StructSchema bazStruct;
  ParsedSchema graultSchema;
  ParsedSchema corgeSchema;
  ParsedSchema barStruct;
  ParsedSchema wrongGraultSchema;
  SchemaParser parser;
  FieldList barFields;
  Reader barProto;
  FakeFileReader reader;
  ParsedSchema barSchema;
  StringPtr importPath [3];
  ParsedSchema local_468;
  Exception *local_458;
  int iStack_450;
  undefined4 uStack_44c;
  uint local_448;
  StructPointerCount local_444;
  int local_440;
  undefined4 uStack_43c;
  StructPointerCount local_434;
  int local_430;
  Exception *local_428;
  undefined1 in_stack_fffffffffffffbf4 [12];
  uint in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc04 [12];
  Schema in_stack_fffffffffffffc10;
  Schema in_stack_fffffffffffffc18;
  Schema local_3e0;
  ArrayPtr<const_char> local_3d8;
  ArrayPtr<const_char> local_3c8;
  ParsedSchema local_3b8;
  ArrayPtr<const_char> local_3a8;
  SchemaParser local_398;
  FieldList local_380;
  Reader local_348;
  StringPtr *local_318;
  undefined8 uStack_310;
  StringPtr *local_308;
  undefined8 uStack_300;
  StringPtr *local_2f8;
  undefined8 uStack_2f0;
  StringPtr *local_2e8;
  undefined8 uStack_2e0;
  StringPtr *local_2d8;
  undefined8 uStack_2d0;
  FakeFileReader local_2c8;
  ArrayPtr<const_char> local_288;
  ParsedSchema local_278;
  Schema local_268;
  undefined4 uStack_260;
  StructReader local_258;
  Schema local_228;
  undefined4 uStack_220;
  StructReader local_218;
  Schema local_1e8;
  undefined4 uStack_1e0;
  StructReader local_1d8;
  Schema local_1a8;
  undefined4 uStack_1a0;
  StructReader local_198;
  Schema local_168;
  undefined4 uStack_160;
  StructReader local_158;
  Schema local_128;
  undefined4 uStack_120;
  StructReader local_118;
  Schema local_e8;
  undefined4 uStack_e0;
  StructReader local_d8;
  Schema local_a8;
  undefined4 uStack_a0;
  StructReader local_98;
  StringPtr local_68;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  
  FakeFileReader::FakeFileReader(&local_2c8);
  SchemaParser::SchemaParser(&local_398);
  SchemaParser::setDiskFilesystem(&local_398,&local_2c8.super_Filesystem);
  name.content.size_ = 0x12;
  name.content.ptr = "src/foo/bar.capnp";
  content.content.size_ = 0xce;
  content.content.ptr =
       "@0x8123456789abcdef;\nstruct Bar {\n  baz @0: import \"baz.capnp\".Baz;\n  corge @1: import \"../qux/corge.capnp\".Corge;\n  grault @2: import \"/grault.capnp\".Grault;\n  garply @3: import \"/garply.capnp\".Garply;\n}\n"
  ;
  FakeFileReader::add(&local_2c8,name,content);
  name_00.content.size_ = 0x12;
  name_00.content.ptr = "src/foo/baz.capnp";
  content_00.content.size_ = 0x24;
  content_00.content.ptr = "@0x823456789abcdef1;\nstruct Baz {}\n";
  FakeFileReader::add(&local_2c8,name_00,content_00);
  name_01.content.size_ = 0x14;
  name_01.content.ptr = "src/qux/corge.capnp";
  content_01.content.size_ = 0x26;
  content_01.content.ptr = "@0x83456789abcdef12;\nstruct Corge {}\n";
  FakeFileReader::add(&local_2c8,name_01,content_01);
  name_02.content.size_ = 0x1a;
  name_02.content.ptr = "/usr/include/grault.capnp";
  content_02.content.size_ = 0x27;
  content_02.content.ptr = "@0x8456789abcdef123;\nstruct Grault {}\n";
  FakeFileReader::add(&local_2c8,name_02,content_02);
  name_03.content.size_ = 0x1a;
  name_03.content.ptr = "/opt/include/grault.capnp";
  content_03.content.size_ = 0x2c;
  content_03.content.ptr = "@0x8000000000000001;\nstruct WrongGrault {}\n";
  FakeFileReader::add(&local_2c8,name_03,content_03);
  name_04.content.size_ = 0x20;
  name_04.content.ptr = "/usr/local/include/garply.capnp";
  content_04.content.size_ = 0x27;
  content_04.content.ptr = "@0x856789abcdef1234;\nstruct Garply {}\n";
  FakeFileReader::add(&local_2c8,name_04,content_04);
  local_68.content.ptr = "/usr/include";
  local_68.content.size_ = 0xd;
  local_58 = "/usr/local/include";
  local_50 = 0x13;
  local_48 = "/opt/include";
  local_40 = 0xd;
  uStack_2d0 = 3;
  importPath_00.size_ = 3;
  importPath_00.ptr = &local_68;
  displayName.content.size_ = 0x10;
  displayName.content.ptr = "foo2/bar2.capnp";
  diskPath.content.size_ = 0x12;
  diskPath.content.ptr = "src/foo/bar.capnp";
  local_2d8 = &local_68;
  local_278 = SchemaParser::parseDiskFile(&local_398,displayName,diskPath,importPath_00);
  Schema::getProto(&local_348,&local_278.super_Schema);
  if (local_348._reader.dataSize < 0x40) {
    if (kj::_::Debug::minSeverity < 3) {
      pcVar7 = (char *)0x0;
LAB_002bdded:
      local_468.super_Schema.raw = (RawBrandedSchema *)0x8123456789abcdef;
      local_380.parent.super_Schema.raw = (Schema)(Schema)pcVar7;
      kj::_::Debug::log<char_const(&)[63],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,100,ERROR,
                 "\"failed: expected \" \"(0x8123456789abcdefull) == (barProto.getId())\", 0x8123456789abcdefull, barProto.getId()"
                 ,(char (*) [63])"failed: expected (0x8123456789abcdefull) == (barProto.getId())",
                 (unsigned_long_long *)&local_468,(unsigned_long *)&local_380);
    }
  }
  else {
    pcVar7 = *local_348._reader.data;
    if ((pcVar7 != (char *)0x8123456789abcdef) && (kj::_::Debug::minSeverity < 3))
    goto LAB_002bdded;
  }
  bVar9 = local_348._reader.pointerCount == 0;
  local_458 = (Exception *)local_348._reader.pointers;
  if (bVar9) {
    local_458 = (Exception *)0x0;
  }
  iStack_450 = 0x7fffffff;
  if (!bVar9) {
    iStack_450 = local_348._reader.nestingLimit;
  }
  local_468.super_Schema.raw = (RawBrandedSchema *)0x0;
  local_468.parser = (SchemaParser *)(CapTableReader *)0x0;
  if (!bVar9) {
    local_468.super_Schema.raw = (RawBrandedSchema *)local_348._reader.segment;
    local_468.parser = (SchemaParser *)local_348._reader.capTable;
  }
  RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_468,(void *)0x0,0);
  if (((RVar13.super_StringPtr.content.size_ != 0x10) ||
      (*(long *)((long)RVar13.super_StringPtr.content.ptr + 7) != 0x706e7061632e3272 ||
       *RVar13.super_StringPtr.content.ptr != 0x7261622f326f6f66)) &&
     (kj::_::Debug::minSeverity < 3)) {
    bVar9 = local_348._reader.pointerCount == 0;
    local_458 = (Exception *)local_348._reader.pointers;
    if (bVar9) {
      local_458 = (Exception *)0x0;
    }
    iStack_450 = 0x7fffffff;
    if (!bVar9) {
      iStack_450 = local_348._reader.nestingLimit;
    }
    local_468.super_Schema.raw = (RawBrandedSchema *)0x0;
    local_468.parser = (SchemaParser *)(CapTableReader *)0x0;
    if (!bVar9) {
      local_468.super_Schema.raw = (RawBrandedSchema *)local_348._reader.segment;
      local_468.parser = (SchemaParser *)local_348._reader.capTable;
    }
    local_380._0_16_ =
         capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_468,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[68],char_const(&)[16],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"(\\\"foo2/bar2.capnp\\\") == (barProto.getDisplayName())\", \"foo2/bar2.capnp\", barProto.getDisplayName()"
               ,(char (*) [68])
                "failed: expected (\"foo2/bar2.capnp\") == (barProto.getDisplayName())",
               (char (*) [16])"foo2/bar2.capnp",(Reader *)&local_380);
  }
  nestedName.content.size_ = 4;
  nestedName.content.ptr = "Bar";
  local_3b8 = ParsedSchema::getNested(&local_278,nestedName);
  local_468.super_Schema.raw = (RawBrandedSchema *)Schema::asStruct(&local_3b8.super_Schema);
  StructSchema::getFields(&local_380,(StructSchema *)&local_468);
  if (local_380.list.reader.elementCount != 4) {
    local_428 = (Exception *)CONCAT44(local_428._4_4_,4);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_468,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x69,FAILED,"(4u) == (barFields.size())","4u, barFields.size()",(uint *)&local_428,
               (uint *)&stack0xfffffffffffffc00);
    kj::_::Debug::Fault::fatal((Fault *)&local_468);
  }
  this_00 = (long)&local_380 + 8;
  SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
  capnp::_::ListReader::getStructElement((StructReader *)&local_458,(ListReader *)this_00,0);
  local_468.parser._0_4_ = 0;
  local_468.super_Schema = SVar2.super_Schema.raw;
  bVar9 = local_434 == 0;
  pWVar4 = (WirePointer *)CONCAT44(uStack_43c,local_440);
  if (bVar9) {
    pWVar4 = (WirePointer *)0x0;
  }
  iVar8 = 0x7fffffff;
  if (!bVar9) {
    iVar8 = local_430;
  }
  pCVar11 = (CapTableReader *)0x0;
  local_428 = (Exception *)0x0;
  if (!bVar9) {
    pCVar11 = (CapTableReader *)CONCAT44(uStack_44c,iStack_450);
    local_428 = local_458;
  }
  RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_428,(void *)0x0,0);
  if (((RVar13.super_StringPtr.content.size_ != 4) ||
      ((char)RVar13.super_StringPtr.content.ptr[1] != 'z' ||
       *RVar13.super_StringPtr.content.ptr != 0x6162)) && (kj::_::Debug::minSeverity < 3)) {
    SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement((StructReader *)&local_458,(ListReader *)this_00,0);
    local_468.parser._0_4_ = 0;
    local_468.super_Schema = SVar2.super_Schema.raw;
    bVar9 = local_434 == 0;
    pWVar4 = (WirePointer *)CONCAT44(uStack_43c,local_440);
    if (bVar9) {
      pWVar4 = (WirePointer *)0x0;
    }
    iVar8 = 0x7fffffff;
    if (!bVar9) {
      iVar8 = local_430;
    }
    pCVar11 = (CapTableReader *)0x0;
    local_428 = (Exception *)0x0;
    if (!bVar9) {
      pCVar11 = (CapTableReader *)CONCAT44(uStack_44c,iStack_450);
      local_428 = local_458;
    }
    RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_428,(void *)0x0,0);
    in_stack_fffffffffffffc00 = (uint)RVar13.super_StringPtr.content.ptr;
    in_stack_fffffffffffffc04 = RVar13.super_StringPtr.content._4_12_;
    kj::_::Debug::log<char_const(&)[64],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6a,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (barFields[0].getProto().getName())\", \"baz\", barFields[0].getProto().getName()"
               ,(char (*) [64])"failed: expected (\"baz\") == (barFields[0].getProto().getName())",
               (char (*) [4])0x4f9fcf,(Reader *)&stack0xfffffffffffffc00);
  }
  SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
  capnp::_::ListReader::getStructElement(&local_98,(ListReader *)this_00,0);
  local_a8 = SVar2.super_Schema.raw;
  uStack_a0 = 0;
  field._8_8_ = pWVar4;
  field.parent.super_Schema.raw = (Schema)(Schema)pCVar11;
  field.proto._reader.segment._0_4_ = iVar8;
  field.proto._reader._4_12_ = in_stack_fffffffffffffbf4;
  field.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
  field.proto._reader._20_12_ = in_stack_fffffffffffffc04;
  field.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
  field.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
  uVar3 = getFieldTypeFileId(field);
  if ((uVar3 != 0x823456789abcdef1) && (kj::_::Debug::minSeverity < 3)) {
    local_468.super_Schema.raw = (RawBrandedSchema *)0x823456789abcdef1;
    SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement(&local_d8,(ListReader *)this_00,0);
    local_e8 = SVar2.super_Schema.raw;
    uStack_e0 = 0;
    field_00._8_8_ = pWVar4;
    field_00.parent.super_Schema.raw = (Schema)(Schema)pCVar11;
    field_00.proto._reader.segment._0_4_ = iVar8;
    field_00.proto._reader._4_12_ = in_stack_fffffffffffffbf4;
    field_00.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
    field_00.proto._reader._20_12_ = in_stack_fffffffffffffc04;
    field_00.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
    field_00.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
    local_428 = (Exception *)getFieldTypeFileId(field_00);
    kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6b,ERROR,
               "\"failed: expected \" \"(0x823456789abcdef1ull) == (getFieldTypeFileId(barFields[0]))\", 0x823456789abcdef1ull, getFieldTypeFileId(barFields[0])"
               ,(char (*) [79])
                "failed: expected (0x823456789abcdef1ull) == (getFieldTypeFileId(barFields[0]))",
               (unsigned_long_long *)&local_468,(unsigned_long *)&local_428);
  }
  SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
  capnp::_::ListReader::getStructElement((StructReader *)&local_458,(ListReader *)this_00,1);
  local_468.parser._0_4_ = 1;
  local_468.super_Schema = SVar2.super_Schema.raw;
  bVar9 = local_434 == 0;
  pWVar4 = (WirePointer *)CONCAT44(uStack_43c,local_440);
  if (bVar9) {
    pWVar4 = (WirePointer *)0x0;
  }
  iVar8 = 0x7fffffff;
  if (!bVar9) {
    iVar8 = local_430;
  }
  pCVar11 = (CapTableReader *)0x0;
  local_428 = (Exception *)0x0;
  if (!bVar9) {
    pCVar11 = (CapTableReader *)CONCAT44(uStack_44c,iStack_450);
    local_428 = local_458;
  }
  RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_428,(void *)0x0,0);
  if (((RVar13.super_StringPtr.content.size_ != 6) ||
      ((char)RVar13.super_StringPtr.content.ptr[1] != 'e' ||
       *RVar13.super_StringPtr.content.ptr != 0x67726f63)) && (kj::_::Debug::minSeverity < 3)) {
    SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement((StructReader *)&local_458,(ListReader *)this_00,1);
    local_468.parser._0_4_ = 1;
    local_468.super_Schema = SVar2.super_Schema.raw;
    bVar9 = local_434 == 0;
    pWVar4 = (WirePointer *)CONCAT44(uStack_43c,local_440);
    if (bVar9) {
      pWVar4 = (WirePointer *)0x0;
    }
    iVar8 = 0x7fffffff;
    if (!bVar9) {
      iVar8 = local_430;
    }
    pCVar11 = (CapTableReader *)0x0;
    local_428 = (Exception *)0x0;
    if (!bVar9) {
      pCVar11 = (CapTableReader *)CONCAT44(uStack_44c,iStack_450);
      local_428 = local_458;
    }
    RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_428,(void *)0x0,0);
    in_stack_fffffffffffffc00 = (uint)RVar13.super_StringPtr.content.ptr;
    in_stack_fffffffffffffc04 = RVar13.super_StringPtr.content._4_12_;
    kj::_::Debug::log<char_const(&)[66],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6c,ERROR,
               "\"failed: expected \" \"(\\\"corge\\\") == (barFields[1].getProto().getName())\", \"corge\", barFields[1].getProto().getName()"
               ,(char (*) [66])"failed: expected (\"corge\") == (barFields[1].getProto().getName())"
               ,(char (*) [6])"corge",(Reader *)&stack0xfffffffffffffc00);
  }
  SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
  capnp::_::ListReader::getStructElement(&local_118,(ListReader *)this_00,1);
  local_128 = SVar2.super_Schema.raw;
  uStack_120 = 1;
  field_01._8_8_ = pWVar4;
  field_01.parent.super_Schema.raw = (Schema)(Schema)pCVar11;
  field_01.proto._reader.segment._0_4_ = iVar8;
  field_01.proto._reader._4_12_ = in_stack_fffffffffffffbf4;
  field_01.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
  field_01.proto._reader._20_12_ = in_stack_fffffffffffffc04;
  field_01.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
  field_01.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
  uVar3 = getFieldTypeFileId(field_01);
  if ((uVar3 != 0x83456789abcdef12) && (kj::_::Debug::minSeverity < 3)) {
    local_468.super_Schema.raw = (RawBrandedSchema *)0x83456789abcdef12;
    SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement(&local_158,(ListReader *)this_00,1);
    local_168 = SVar2.super_Schema.raw;
    uStack_160 = 1;
    field_02._8_8_ = pWVar4;
    field_02.parent.super_Schema.raw = (Schema)(Schema)pCVar11;
    field_02.proto._reader.segment._0_4_ = iVar8;
    field_02.proto._reader._4_12_ = in_stack_fffffffffffffbf4;
    field_02.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
    field_02.proto._reader._20_12_ = in_stack_fffffffffffffc04;
    field_02.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
    field_02.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
    local_428 = (Exception *)getFieldTypeFileId(field_02);
    kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6d,ERROR,
               "\"failed: expected \" \"(0x83456789abcdef12ull) == (getFieldTypeFileId(barFields[1]))\", 0x83456789abcdef12ull, getFieldTypeFileId(barFields[1])"
               ,(char (*) [79])
                "failed: expected (0x83456789abcdef12ull) == (getFieldTypeFileId(barFields[1]))",
               (unsigned_long_long *)&local_468,(unsigned_long *)&local_428);
  }
  SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
  capnp::_::ListReader::getStructElement((StructReader *)&local_458,(ListReader *)this_00,2);
  local_468.parser._0_4_ = 2;
  local_468.super_Schema = SVar2.super_Schema.raw;
  bVar9 = local_434 == 0;
  pWVar4 = (WirePointer *)CONCAT44(uStack_43c,local_440);
  if (bVar9) {
    pWVar4 = (WirePointer *)0x0;
  }
  iVar8 = 0x7fffffff;
  if (!bVar9) {
    iVar8 = local_430;
  }
  pCVar11 = (CapTableReader *)0x0;
  local_428 = (Exception *)0x0;
  if (!bVar9) {
    pCVar11 = (CapTableReader *)CONCAT44(uStack_44c,iStack_450);
    local_428 = local_458;
  }
  RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_428,(void *)0x0,0);
  if (((RVar13.super_StringPtr.content.size_ != 7) ||
      ((short)RVar13.super_StringPtr.content.ptr[1] != 0x746c ||
       *RVar13.super_StringPtr.content.ptr != 0x75617267)) && (kj::_::Debug::minSeverity < 3)) {
    SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement((StructReader *)&local_458,(ListReader *)this_00,2);
    local_468.parser._0_4_ = 2;
    local_468.super_Schema = SVar2.super_Schema.raw;
    bVar9 = local_434 == 0;
    pWVar4 = (WirePointer *)CONCAT44(uStack_43c,local_440);
    if (bVar9) {
      pWVar4 = (WirePointer *)0x0;
    }
    iVar8 = 0x7fffffff;
    if (!bVar9) {
      iVar8 = local_430;
    }
    pCVar11 = (CapTableReader *)0x0;
    local_428 = (Exception *)0x0;
    if (!bVar9) {
      pCVar11 = (CapTableReader *)CONCAT44(uStack_44c,iStack_450);
      local_428 = local_458;
    }
    RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_428,(void *)0x0,0);
    in_stack_fffffffffffffc00 = (uint)RVar13.super_StringPtr.content.ptr;
    in_stack_fffffffffffffc04 = RVar13.super_StringPtr.content._4_12_;
    kj::_::Debug::log<char_const(&)[67],char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6e,ERROR,
               "\"failed: expected \" \"(\\\"grault\\\") == (barFields[2].getProto().getName())\", \"grault\", barFields[2].getProto().getName()"
               ,(char (*) [67])
                "failed: expected (\"grault\") == (barFields[2].getProto().getName())",
               (char (*) [7])"grault",(Reader *)&stack0xfffffffffffffc00);
  }
  SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
  capnp::_::ListReader::getStructElement(&local_198,(ListReader *)this_00,2);
  local_1a8 = SVar2.super_Schema.raw;
  uStack_1a0 = 2;
  field_03._8_8_ = pWVar4;
  field_03.parent.super_Schema.raw = (Schema)(Schema)pCVar11;
  field_03.proto._reader.segment._0_4_ = iVar8;
  field_03.proto._reader._4_12_ = in_stack_fffffffffffffbf4;
  field_03.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
  field_03.proto._reader._20_12_ = in_stack_fffffffffffffc04;
  field_03.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
  field_03.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
  uVar3 = getFieldTypeFileId(field_03);
  if ((uVar3 != 0x8456789abcdef123) && (kj::_::Debug::minSeverity < 3)) {
    local_468.super_Schema.raw = (RawBrandedSchema *)0x8456789abcdef123;
    SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement(&local_1d8,(ListReader *)this_00,2);
    local_1e8 = SVar2.super_Schema.raw;
    uStack_1e0 = 2;
    field_04._8_8_ = pWVar4;
    field_04.parent.super_Schema.raw = (Schema)(Schema)pCVar11;
    field_04.proto._reader.segment._0_4_ = iVar8;
    field_04.proto._reader._4_12_ = in_stack_fffffffffffffbf4;
    field_04.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
    field_04.proto._reader._20_12_ = in_stack_fffffffffffffc04;
    field_04.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
    field_04.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
    local_428 = (Exception *)getFieldTypeFileId(field_04);
    kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x6f,ERROR,
               "\"failed: expected \" \"(0x8456789abcdef123ull) == (getFieldTypeFileId(barFields[2]))\", 0x8456789abcdef123ull, getFieldTypeFileId(barFields[2])"
               ,(char (*) [79])
                "failed: expected (0x8456789abcdef123ull) == (getFieldTypeFileId(barFields[2]))",
               (unsigned_long_long *)&local_468,(unsigned_long *)&local_428);
  }
  SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
  capnp::_::ListReader::getStructElement((StructReader *)&local_458,(ListReader *)this_00,3);
  local_468.parser._0_4_ = 3;
  local_468.super_Schema = SVar2.super_Schema.raw;
  bVar9 = local_434 == 0;
  pWVar4 = (WirePointer *)CONCAT44(uStack_43c,local_440);
  if (bVar9) {
    pWVar4 = (WirePointer *)0x0;
  }
  iVar8 = 0x7fffffff;
  if (!bVar9) {
    iVar8 = local_430;
  }
  pCVar11 = (CapTableReader *)0x0;
  local_428 = (Exception *)0x0;
  if (!bVar9) {
    pCVar11 = (CapTableReader *)CONCAT44(uStack_44c,iStack_450);
    local_428 = local_458;
  }
  RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_428,(void *)0x0,0);
  if (((RVar13.super_StringPtr.content.size_ != 7) ||
      ((short)RVar13.super_StringPtr.content.ptr[1] != 0x796c ||
       *RVar13.super_StringPtr.content.ptr != 0x70726167)) && (kj::_::Debug::minSeverity < 3)) {
    SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement((StructReader *)&local_458,(ListReader *)this_00,3);
    local_468.parser._0_4_ = 3;
    local_468.super_Schema = SVar2.super_Schema.raw;
    bVar9 = local_434 == 0;
    pWVar4 = (WirePointer *)CONCAT44(uStack_43c,local_440);
    if (bVar9) {
      pWVar4 = (WirePointer *)0x0;
    }
    iVar8 = 0x7fffffff;
    if (!bVar9) {
      iVar8 = local_430;
    }
    pCVar11 = (CapTableReader *)0x0;
    local_428 = (Exception *)0x0;
    if (!bVar9) {
      pCVar11 = (CapTableReader *)CONCAT44(uStack_44c,iStack_450);
      local_428 = local_458;
    }
    RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_428,(void *)0x0,0);
    in_stack_fffffffffffffc00 = (uint)RVar13.super_StringPtr.content.ptr;
    in_stack_fffffffffffffc04 = RVar13.super_StringPtr.content._4_12_;
    kj::_::Debug::log<char_const(&)[67],char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x70,ERROR,
               "\"failed: expected \" \"(\\\"garply\\\") == (barFields[3].getProto().getName())\", \"garply\", barFields[3].getProto().getName()"
               ,(char (*) [67])
                "failed: expected (\"garply\") == (barFields[3].getProto().getName())",
               (char (*) [7])0x4e4cd1,(Reader *)&stack0xfffffffffffffc00);
  }
  SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
  capnp::_::ListReader::getStructElement(&local_218,(ListReader *)this_00,3);
  local_228 = SVar2.super_Schema.raw;
  uStack_220 = 3;
  field_05._8_8_ = pWVar4;
  field_05.parent.super_Schema.raw = (Schema)(Schema)pCVar11;
  field_05.proto._reader.segment._0_4_ = iVar8;
  field_05.proto._reader._4_12_ = in_stack_fffffffffffffbf4;
  field_05.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
  field_05.proto._reader._20_12_ = in_stack_fffffffffffffc04;
  field_05.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
  field_05.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
  uVar3 = getFieldTypeFileId(field_05);
  if ((uVar3 != 0x856789abcdef1234) && (kj::_::Debug::minSeverity < 3)) {
    local_468.super_Schema.raw = (RawBrandedSchema *)0x856789abcdef1234;
    SVar2.super_Schema.raw = local_380.parent.super_Schema.raw;
    capnp::_::ListReader::getStructElement(&local_258,(ListReader *)this_00,3);
    local_268 = SVar2.super_Schema.raw;
    uStack_260 = 3;
    field_06._8_8_ = pWVar4;
    field_06.parent.super_Schema.raw = (Schema)(Schema)pCVar11;
    field_06.proto._reader.segment._0_4_ = iVar8;
    field_06.proto._reader._4_12_ = in_stack_fffffffffffffbf4;
    field_06.proto._reader.data._0_4_ = in_stack_fffffffffffffc00;
    field_06.proto._reader._20_12_ = in_stack_fffffffffffffc04;
    field_06.proto._reader._32_8_ = in_stack_fffffffffffffc10.raw;
    field_06.proto._reader._40_8_ = in_stack_fffffffffffffc18.raw;
    local_428 = (Exception *)getFieldTypeFileId(field_06);
    kj::_::Debug::log<char_const(&)[79],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x71,ERROR,
               "\"failed: expected \" \"(0x856789abcdef1234ull) == (getFieldTypeFileId(barFields[3]))\", 0x856789abcdef1234ull, getFieldTypeFileId(barFields[3])"
               ,(char (*) [79])
                "failed: expected (0x856789abcdef1234ull) == (getFieldTypeFileId(barFields[3]))",
               (unsigned_long_long *)&local_468,(unsigned_long *)&local_428);
  }
  uStack_2e0 = 3;
  importPath_01.size_ = 3;
  importPath_01.ptr = &local_68;
  displayName_00.content.size_ = 0x20;
  displayName_00.content.ptr = "not/used/because/already/loaded";
  diskPath_00.content.size_ = 0x12;
  diskPath_00.content.ptr = "src/foo/baz.capnp";
  local_2e8 = &local_68;
  SchemaParser::parseDiskFile(&local_398,displayName_00,diskPath_00,importPath_01);
  Schema::getProto((Reader *)&local_468,(Schema *)&stack0xfffffffffffffc00);
  if (((local_448 < 0x40) || ((local_458->ownFile).content.ptr != (char *)0x823456789abcdef1)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_428 = (Exception *)0x823456789abcdef1;
    Schema::getProto((Reader *)&local_468,(Schema *)&stack0xfffffffffffffc00);
    if (local_448 < 0x40) {
      local_3c8.ptr = (char *)0x0;
    }
    else {
      local_3c8.ptr = (local_458->ownFile).content.ptr;
    }
    kj::_::Debug::log<char_const(&)[75],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x76,ERROR,
               "\"failed: expected \" \"(0x823456789abcdef1ull) == (bazSchema.getProto().getId())\", 0x823456789abcdef1ull, bazSchema.getProto().getId()"
               ,(char (*) [75])
                "failed: expected (0x823456789abcdef1ull) == (bazSchema.getProto().getId())",
               (unsigned_long_long *)&local_428,(unsigned_long *)&local_3c8);
  }
  Schema::getProto((Reader *)&local_468,(Schema *)&stack0xfffffffffffffc00);
  local_428 = (Exception *)(RawBrandedSchema *)0x0;
  if (local_444 != 0) {
    local_428 = (Exception *)local_468.super_Schema.raw;
  }
  RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_428,(void *)0x0,0);
  if (((RVar13.super_StringPtr.content.size_ != 0xf) ||
      (*(long *)((long)RVar13.super_StringPtr.content.ptr + 6) != 0x706e7061632e7a61 ||
       *RVar13.super_StringPtr.content.ptr != 0x7a61622f326f6f66)) &&
     (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&local_468,(Schema *)&stack0xfffffffffffffc00);
    local_428 = (Exception *)(RawBrandedSchema *)0x0;
    if (local_444 != 0) {
      local_428 = (Exception *)local_468.super_Schema.raw;
    }
    local_3c8 = (ArrayPtr<const_char>)
                capnp::_::PointerReader::getBlob<capnp::Text>
                          ((PointerReader *)&local_428,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[79],char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x77,ERROR,
               "\"failed: expected \" \"(\\\"foo2/baz.capnp\\\") == (bazSchema.getProto().getDisplayName())\", \"foo2/baz.capnp\", bazSchema.getProto().getDisplayName()"
               ,(char (*) [79])
                "failed: expected (\"foo2/baz.capnp\") == (bazSchema.getProto().getDisplayName())",
               (char (*) [15])"foo2/baz.capnp",(Reader *)&local_3c8);
  }
  nestedName_00.content.size_ = 4;
  nestedName_00.content.ptr = "Baz";
  local_468 = ParsedSchema::getNested((ParsedSchema *)&stack0xfffffffffffffc00,nestedName_00);
  local_3e0.raw = (RawBrandedSchema *)Schema::asStruct(&local_468.super_Schema);
  Schema::getProto((Reader *)&local_468,&local_3e0);
  if (local_448 < 0x40) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (local_458->ownFile).content.ptr;
  }
  SVar5 = Schema::getDependency(&local_3b8.super_Schema,(uint64_t)pcVar7,0);
  if ((local_3e0.raw != SVar5.raw) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&local_468,&local_3e0);
    if (local_448 < 0x40) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = (local_458->ownFile).content.ptr;
    }
    local_428 = (Exception *)Schema::getDependency(&local_3b8.super_Schema,(uint64_t)pcVar7,0);
    kj::_::Debug::log<char_const(&)[88],capnp::StructSchema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x79,ERROR,
               "\"failed: expected \" \"(bazStruct) == (barStruct.getDependency(bazStruct.getProto().getId()))\", bazStruct, barStruct.getDependency(bazStruct.getProto().getId())"
               ,(char (*) [88])
                "failed: expected (bazStruct) == (barStruct.getDependency(bazStruct.getProto().getId()))"
               ,(StructSchema *)&local_3e0,(Schema *)&local_428);
  }
  uStack_2f0 = 3;
  importPath_02.size_ = 3;
  importPath_02.ptr = &local_68;
  displayName_01.content.size_ = 0x20;
  displayName_01.content.ptr = "not/used/because/already/loaded";
  diskPath_01.content.size_ = 0x14;
  diskPath_01.content.ptr = "src/qux/corge.capnp";
  local_2f8 = &local_68;
  local_3c8 = (ArrayPtr<const_char>)
              SchemaParser::parseDiskFile(&local_398,displayName_01,diskPath_01,importPath_02);
  Schema::getProto((Reader *)&local_468,(Schema *)&local_3c8);
  if (((local_448 < 0x40) || ((local_458->ownFile).content.ptr != (char *)0x83456789abcdef12)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_428 = (Exception *)0x83456789abcdef12;
    Schema::getProto((Reader *)&local_468,(Schema *)&local_3c8);
    if (local_448 < 0x40) {
      local_3d8.ptr = (char *)0x0;
    }
    else {
      local_3d8.ptr = (local_458->ownFile).content.ptr;
    }
    kj::_::Debug::log<char_const(&)[77],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x7e,ERROR,
               "\"failed: expected \" \"(0x83456789abcdef12ull) == (corgeSchema.getProto().getId())\", 0x83456789abcdef12ull, corgeSchema.getProto().getId()"
               ,(char (*) [77])
                "failed: expected (0x83456789abcdef12ull) == (corgeSchema.getProto().getId())",
               (unsigned_long_long *)&local_428,(unsigned_long *)&local_3d8);
  }
  Schema::getProto((Reader *)&local_468,(Schema *)&local_3c8);
  local_428 = (Exception *)0x0;
  if (local_444 != 0) {
    local_428 = (Exception *)local_468.super_Schema.raw;
  }
  RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_428,(void *)0x0,0);
  if (((RVar13.super_StringPtr.content.size_ != 0x10) ||
      (*(long *)((long)RVar13.super_StringPtr.content.ptr + 7) != 0x706e7061632e6567 ||
       *RVar13.super_StringPtr.content.ptr != 0x67726f632f787571)) &&
     (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&local_468,(Schema *)&local_3c8);
    local_428 = (Exception *)0x0;
    if (local_444 != 0) {
      local_428 = (Exception *)local_468.super_Schema.raw;
    }
    local_3d8 = (ArrayPtr<const_char>)
                capnp::_::PointerReader::getBlob<capnp::Text>
                          ((PointerReader *)&local_428,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[82],char_const(&)[16],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x7f,ERROR,
               "\"failed: expected \" \"(\\\"qux/corge.capnp\\\") == (corgeSchema.getProto().getDisplayName())\", \"qux/corge.capnp\", corgeSchema.getProto().getDisplayName()"
               ,(char (*) [82])
                "failed: expected (\"qux/corge.capnp\") == (corgeSchema.getProto().getDisplayName())"
               ,(char (*) [16])0x4bda7a,(Reader *)&local_3d8);
  }
  nestedName_01.content.size_ = 6;
  nestedName_01.content.ptr = "Corge";
  local_468 = ParsedSchema::getNested((ParsedSchema *)&local_3c8,nestedName_01);
  SVar5.raw = (RawBrandedSchema *)Schema::asStruct(&local_468.super_Schema);
  Schema::getProto((Reader *)&local_468,(Schema *)&stack0xfffffffffffffc18);
  if (local_448 < 0x40) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (local_458->ownFile).content.ptr;
  }
  SVar6 = Schema::getDependency(&local_3b8.super_Schema,(uint64_t)pcVar7,0);
  if ((SVar5.raw != SVar6.raw) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&local_468,(Schema *)&stack0xfffffffffffffc18);
    if (local_448 < 0x40) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = (local_458->ownFile).content.ptr;
    }
    local_428 = (Exception *)Schema::getDependency(&local_3b8.super_Schema,(uint64_t)pcVar7,0);
    kj::_::Debug::log<char_const(&)[92],capnp::StructSchema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x81,ERROR,
               "\"failed: expected \" \"(corgeStruct) == (barStruct.getDependency(corgeStruct.getProto().getId()))\", corgeStruct, barStruct.getDependency(corgeStruct.getProto().getId())"
               ,(char (*) [92])
                "failed: expected (corgeStruct) == (barStruct.getDependency(corgeStruct.getProto().getId()))"
               ,(StructSchema *)&stack0xfffffffffffffc18,(Schema *)&local_428);
  }
  uStack_300 = 3;
  importPath_03.size_ = 3;
  importPath_03.ptr = &local_68;
  displayName_02.content.size_ = 0x20;
  displayName_02.content.ptr = "not/used/because/already/loaded";
  diskPath_02.content.size_ = 0x1a;
  diskPath_02.content.ptr = "/usr/include/grault.capnp";
  local_308 = &local_68;
  local_3d8 = (ArrayPtr<const_char>)
              SchemaParser::parseDiskFile(&local_398,displayName_02,diskPath_02,importPath_03);
  Schema::getProto((Reader *)&local_468,(Schema *)&local_3d8);
  if (((local_448 < 0x40) || ((local_458->ownFile).content.ptr != (char *)0x8456789abcdef123)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_428 = (Exception *)0x8456789abcdef123;
    Schema::getProto((Reader *)&local_468,(Schema *)&local_3d8);
    if (local_448 < 0x40) {
      local_3a8.ptr = (char *)0x0;
    }
    else {
      local_3a8.ptr = (local_458->ownFile).content.ptr;
    }
    kj::_::Debug::log<char_const(&)[78],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x86,ERROR,
               "\"failed: expected \" \"(0x8456789abcdef123ull) == (graultSchema.getProto().getId())\", 0x8456789abcdef123ull, graultSchema.getProto().getId()"
               ,(char (*) [78])
                "failed: expected (0x8456789abcdef123ull) == (graultSchema.getProto().getId())",
               (unsigned_long_long *)&local_428,(unsigned_long *)&local_3a8);
  }
  Schema::getProto((Reader *)&local_468,(Schema *)&local_3d8);
  local_428 = (Exception *)0x0;
  if (local_444 != 0) {
    local_428 = (Exception *)local_468.super_Schema.raw;
  }
  RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_428,(void *)0x0,0);
  if (((RVar13.super_StringPtr.content.size_ != 0xd) ||
      ((int)RVar13.super_StringPtr.content.ptr[1] != 0x706e7061 ||
       *RVar13.super_StringPtr.content.ptr != 0x632e746c75617267)) &&
     (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&local_468,(Schema *)&local_3d8);
    local_428 = (Exception *)0x0;
    if (local_444 != 0) {
      local_428 = (Exception *)local_468.super_Schema.raw;
    }
    local_3a8 = (ArrayPtr<const_char>)
                capnp::_::PointerReader::getBlob<capnp::Text>
                          ((PointerReader *)&local_428,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[80],char_const(&)[13],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x87,ERROR,
               "\"failed: expected \" \"(\\\"grault.capnp\\\") == (graultSchema.getProto().getDisplayName())\", \"grault.capnp\", graultSchema.getProto().getDisplayName()"
               ,(char (*) [80])
                "failed: expected (\"grault.capnp\") == (graultSchema.getProto().getDisplayName())",
               (char (*) [13])0x4bdabd,(Reader *)&local_3a8);
  }
  nestedName_02.content.size_ = 7;
  nestedName_02.content.ptr = "Grault";
  local_468 = ParsedSchema::getNested((ParsedSchema *)&local_3d8,nestedName_02);
  SVar5.raw = (RawBrandedSchema *)Schema::asStruct(&local_468.super_Schema);
  Schema::getProto((Reader *)&local_468,(Schema *)&stack0xfffffffffffffc10);
  if (local_448 < 0x40) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (local_458->ownFile).content.ptr;
  }
  SVar6 = Schema::getDependency(&local_3b8.super_Schema,(uint64_t)pcVar7,0);
  if ((SVar5.raw != SVar6.raw) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&local_468,(Schema *)&stack0xfffffffffffffc10);
    if (local_448 < 0x40) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = (local_458->ownFile).content.ptr;
    }
    local_428 = (Exception *)Schema::getDependency(&local_3b8.super_Schema,(uint64_t)pcVar7,0);
    kj::_::Debug::log<char_const(&)[94],capnp::StructSchema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x89,ERROR,
               "\"failed: expected \" \"(graultStruct) == (barStruct.getDependency(graultStruct.getProto().getId()))\", graultStruct, barStruct.getDependency(graultStruct.getProto().getId())"
               ,(char (*) [94])
                "failed: expected (graultStruct) == (barStruct.getDependency(graultStruct.getProto().getId()))"
               ,(StructSchema *)&stack0xfffffffffffffc10,(Schema *)&local_428);
  }
  uStack_310 = 3;
  importPath_04.size_ = 3;
  importPath_04.ptr = &local_68;
  displayName_03.content.size_ = 0x19;
  displayName_03.content.ptr = "weird/display/name.capnp";
  diskPath_03.content.size_ = 0x1a;
  diskPath_03.content.ptr = "/opt/include/grault.capnp";
  local_318 = &local_68;
  local_3a8 = (ArrayPtr<const_char>)
              SchemaParser::parseDiskFile(&local_398,displayName_03,diskPath_03,importPath_04);
  Schema::getProto((Reader *)&local_468,(Schema *)&local_3a8);
  if (((local_448 < 0x40) || ((local_458->ownFile).content.ptr != (char *)0x8000000000000001)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_428 = (Exception *)0x8000000000000001;
    Schema::getProto((Reader *)&local_468,(Schema *)&local_3a8);
    if (local_448 < 0x40) {
      local_288.ptr = (char *)0x0;
    }
    else {
      local_288.ptr = (local_458->ownFile).content.ptr;
    }
    kj::_::Debug::log<char_const(&)[83],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"(0x8000000000000001ull) == (wrongGraultSchema.getProto().getId())\", 0x8000000000000001ull, wrongGraultSchema.getProto().getId()"
               ,(char (*) [83])
                "failed: expected (0x8000000000000001ull) == (wrongGraultSchema.getProto().getId())"
               ,(unsigned_long_long *)&local_428,(unsigned_long *)&local_288);
  }
  Schema::getProto((Reader *)&local_468,(Schema *)&local_3a8);
  local_428 = (Exception *)0x0;
  if (local_444 != 0) {
    local_428 = (Exception *)local_468.super_Schema.raw;
  }
  RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_428,(void *)0x0,0);
  pcVar7 = RVar13.super_StringPtr.content.ptr;
  if (RVar13.super_StringPtr.content.size_ == 0x19) {
    uVar1 = *(undefined8 *)(pcVar7 + 0x10);
    auVar12[0] = -((char)uVar1 == 'm');
    auVar12[1] = -((char)((ulong)uVar1 >> 8) == 'e');
    auVar12[2] = -((char)((ulong)uVar1 >> 0x10) == '.');
    auVar12[3] = -((char)((ulong)uVar1 >> 0x18) == 'c');
    auVar12[4] = -((char)((ulong)uVar1 >> 0x20) == 'a');
    auVar12[5] = -((char)((ulong)uVar1 >> 0x28) == 'p');
    auVar12[6] = -((char)((ulong)uVar1 >> 0x30) == 'n');
    auVar12[7] = -((char)((ulong)uVar1 >> 0x38) == 'p');
    auVar12[8] = 0xff;
    auVar12[9] = 0xff;
    auVar12[10] = 0xff;
    auVar12[0xb] = 0xff;
    auVar12[0xc] = 0xff;
    auVar12[0xd] = 0xff;
    auVar12[0xe] = 0xff;
    auVar12[0xf] = 0xff;
    auVar10[0] = -(*pcVar7 == 'w');
    auVar10[1] = -(pcVar7[1] == 'e');
    auVar10[2] = -(pcVar7[2] == 'i');
    auVar10[3] = -(pcVar7[3] == 'r');
    auVar10[4] = -(pcVar7[4] == 'd');
    auVar10[5] = -(pcVar7[5] == '/');
    auVar10[6] = -(pcVar7[6] == 'd');
    auVar10[7] = -(pcVar7[7] == 'i');
    auVar10[8] = -(pcVar7[8] == 's');
    auVar10[9] = -(pcVar7[9] == 'p');
    auVar10[10] = -(pcVar7[10] == 'l');
    auVar10[0xb] = -(pcVar7[0xb] == 'a');
    auVar10[0xc] = -(pcVar7[0xc] == 'y');
    auVar10[0xd] = -(pcVar7[0xd] == '/');
    auVar10[0xe] = -(pcVar7[0xe] == 'n');
    auVar10[0xf] = -(pcVar7[0xf] == 'a');
    auVar10 = auVar10 & auVar12;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) goto LAB_002bf45a;
  }
  if (kj::_::Debug::minSeverity < 3) {
    Schema::getProto((Reader *)&local_468,(Schema *)&local_3a8);
    local_428 = (Exception *)0x0;
    if (local_444 != 0) {
      local_428 = (Exception *)local_468.super_Schema.raw;
    }
    local_288 = (ArrayPtr<const_char>)
                capnp::_::PointerReader::getBlob<capnp::Text>
                          ((PointerReader *)&local_428,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[97],char_const(&)[25],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(\\\"weird/display/name.capnp\\\") == (wrongGraultSchema.getProto().getDisplayName())\", \"weird/display/name.capnp\", wrongGraultSchema.getProto().getDisplayName()"
               ,(char (*) [97])
                "failed: expected (\"weird/display/name.capnp\") == (wrongGraultSchema.getProto().getDisplayName())"
               ,(char (*) [25])"weird/display/name.capnp",(Reader *)&local_288);
  }
LAB_002bf45a:
  SchemaParser::~SchemaParser(&local_398);
  FakeFileReader::~FakeFileReader(&local_2c8);
  return;
}

Assistant:

TEST(SchemaParser, Basic) {
  FakeFileReader reader;
  SchemaParser parser;
  parser.setDiskFilesystem(reader);

  reader.add("src/foo/bar.capnp",
      "@0x8123456789abcdef;\n"
      "struct Bar {\n"
      "  baz @0: import \"baz.capnp\".Baz;\n"
      "  corge @1: import \"../qux/corge.capnp\".Corge;\n"
      "  grault @2: import \"/grault.capnp\".Grault;\n"
      "  garply @3: import \"/garply.capnp\".Garply;\n"
      "}\n");
  reader.add("src/foo/baz.capnp",
      "@0x823456789abcdef1;\n"
      "struct Baz {}\n");
  reader.add("src/qux/corge.capnp",
      "@0x83456789abcdef12;\n"
      "struct Corge {}\n");
  reader.add(ABS("usr/include/grault.capnp"),
      "@0x8456789abcdef123;\n"
      "struct Grault {}\n");
  reader.add(ABS("opt/include/grault.capnp"),
      "@0x8000000000000001;\n"
      "struct WrongGrault {}\n");
  reader.add(ABS("usr/local/include/garply.capnp"),
      "@0x856789abcdef1234;\n"
      "struct Garply {}\n");

  kj::StringPtr importPath[] = {
    ABS("usr/include"), ABS("usr/local/include"), ABS("opt/include")
  };

  ParsedSchema barSchema = parser.parseDiskFile(
      "foo2/bar2.capnp", "src/foo/bar.capnp", importPath);

  auto barProto = barSchema.getProto();
  EXPECT_EQ(0x8123456789abcdefull, barProto.getId());
  EXPECT_EQ("foo2/bar2.capnp", barProto.getDisplayName());

  auto barStruct = barSchema.getNested("Bar");
  auto barFields = barStruct.asStruct().getFields();
  ASSERT_EQ(4u, barFields.size());
  EXPECT_EQ("baz", barFields[0].getProto().getName());
  EXPECT_EQ(0x823456789abcdef1ull, getFieldTypeFileId(barFields[0]));
  EXPECT_EQ("corge", barFields[1].getProto().getName());
  EXPECT_EQ(0x83456789abcdef12ull, getFieldTypeFileId(barFields[1]));
  EXPECT_EQ("grault", barFields[2].getProto().getName());
  EXPECT_EQ(0x8456789abcdef123ull, getFieldTypeFileId(barFields[2]));
  EXPECT_EQ("garply", barFields[3].getProto().getName());
  EXPECT_EQ(0x856789abcdef1234ull, getFieldTypeFileId(barFields[3]));

  auto bazSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      "src/foo/baz.capnp", importPath);
  EXPECT_EQ(0x823456789abcdef1ull, bazSchema.getProto().getId());
  EXPECT_EQ("foo2/baz.capnp", bazSchema.getProto().getDisplayName());
  auto bazStruct = bazSchema.getNested("Baz").asStruct();
  EXPECT_EQ(bazStruct, barStruct.getDependency(bazStruct.getProto().getId()));

  auto corgeSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      "src/qux/corge.capnp", importPath);
  EXPECT_EQ(0x83456789abcdef12ull, corgeSchema.getProto().getId());
  EXPECT_EQ("qux/corge.capnp", corgeSchema.getProto().getDisplayName());
  auto corgeStruct = corgeSchema.getNested("Corge").asStruct();
  EXPECT_EQ(corgeStruct, barStruct.getDependency(corgeStruct.getProto().getId()));

  auto graultSchema = parser.parseDiskFile(
      "not/used/because/already/loaded",
      ABS("usr/include/grault.capnp"), importPath);
  EXPECT_EQ(0x8456789abcdef123ull, graultSchema.getProto().getId());
  EXPECT_EQ("grault.capnp", graultSchema.getProto().getDisplayName());
  auto graultStruct = graultSchema.getNested("Grault").asStruct();
  EXPECT_EQ(graultStruct, barStruct.getDependency(graultStruct.getProto().getId()));

  // Try importing the other grault.capnp directly.  It'll get the display name we specify since
  // it wasn't imported before.
  auto wrongGraultSchema = parser.parseDiskFile(
      "weird/display/name.capnp",
      ABS("opt/include/grault.capnp"), importPath);
  EXPECT_EQ(0x8000000000000001ull, wrongGraultSchema.getProto().getId());
  EXPECT_EQ("weird/display/name.capnp", wrongGraultSchema.getProto().getDisplayName());
}